

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O3

void gpc_unpc(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  double local_20;
  
  iVar2 = in->a;
  if (iVar2 < 0x81) {
    out->b = 0xff;
    out->r = 0xff;
    out->g = 0xff;
    uVar1 = 0;
  }
  else {
    dVar3 = (double)in->r / (double)iVar2;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
      iVar2 = in->a;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    out->r = (int)dVar3 & 0xff;
    local_20 = (double)iVar2;
    dVar3 = (double)in->g / local_20;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
      local_20 = (double)in->a;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    out->g = (int)dVar3 & 0xff;
    dVar3 = (double)in->b / local_20;
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
      local_20 = (double)in->a;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    out->b = (int)dVar3 & 0xff;
    dVar3 = floor(local_20 / 257.0 + 0.5);
    uVar1 = (int)dVar3 & 0xff;
  }
  out->a = uVar1;
  return;
}

Assistant:

static void
gpc_unpc(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = sRGB((double)in->r / in->a);
      out->g = sRGB((double)in->g / in->a);
      out->b = sRGB((double)in->b / in->a);
      out->a = u8d(in->a / 257.);
   }
}